

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfunc.cpp
# Opt level: O0

int __thiscall CVmFuncPtr::set(CVmFuncPtr *this,vm_val_t *val)

{
  uint uVar1;
  int iVar2;
  CVmObject *pCVar3;
  uchar *p;
  vm_bif_desc *pvVar4;
  int *in_RSI;
  CVmFuncPtr *in_RDI;
  vm_bif_desc *desc;
  vm_val_t invoker;
  CVmPoolInMem *in_stack_ffffffffffffffd0;
  int local_28 [4];
  int *local_18;
  
  local_18 = in_RSI;
  while (uVar1 = *local_18 - 4, uVar1 < 0xe || *local_18 == 0x12) {
    switch((long)&switchD_00300dc5::switchdataD_00385834 +
           (long)(int)(&switchD_00300dc5::switchdataD_00385834)[uVar1]) {
    case 0x300dc7:
      pCVar3 = vm_objp(0);
      iVar2 = (*pCVar3->_vptr_CVmObject[0xe])(pCVar3,local_28);
      if (iVar2 == 0) {
        set(in_RDI,(uchar *)0x0);
        return 0;
      }
      local_18 = local_28;
      break;
    case 0x300e13:
      p = (uchar *)CVmPoolInMem::get_ptr
                             (in_stack_ffffffffffffffd0,(pool_ofs_t)((ulong)in_RDI >> 0x20));
      set(in_RDI,p);
      return 1;
    case 0x300e41:
      set(in_RDI,*(uchar **)(local_18 + 2));
      return 1;
    case 0x300e5e:
      pvVar4 = CVmBifTable::get_desc
                         (G_bif_table_X,(uint)*(ushort *)(local_18 + 2),
                          (uint)*(ushort *)((long)local_18 + 10));
      if (pvVar4 == (vm_bif_desc *)0x0) {
        return 0;
      }
      set(in_RDI,(uchar *)pvVar4->synth_hdr);
      return 1;
    case 0x300eb3:
      goto switchD_00300dc5_caseD_300eb3;
    }
  }
switchD_00300dc5_caseD_300eb3:
  set(in_RDI,(uchar *)0x0);
  return 0;
}

Assistant:

int CVmFuncPtr::set(VMG_ const vm_val_t *val)
{
    vm_val_t invoker;
    
    /* we might need to re-resolve from an invoker, so loop until resolved */
    for (;;)
    {
        /* check the type */
        switch (val->typ)
        {
        case VM_OBJ:
        case VM_OBJX:
            /* object - check to see if it's invokable */
            if (vm_objp(vmg_ val->val.obj)->get_invoker(vmg_ &invoker))
            {
                /* it's invokable - re-resolve using the invoker */
                val = &invoker;
            }
            else
            {
                /* other object types are not function pointers */
                set((uchar *)0);
                return FALSE;
            }
            break;
            
        case VM_FUNCPTR:
        case VM_CODEOFS:
            /* function pointer - get the address from the code pool */
            set((const uchar *)G_code_pool->get_ptr(val->val.ofs));
            return TRUE;
            
        case VM_CODEPTR:
            /* direct code pointer - the value contains the address */
            set((const uchar *)val->val.ptr);
            return TRUE;
            
        case VM_BIFPTR:
        case VM_BIFPTRX:
            /* built-in function pointer */
            {
                /* 
                 *   decode the function set information from the value, and
                 *   look up the bif descriptor in the registration table 
                 */
                const vm_bif_desc *desc = G_bif_table->get_desc(
                    val->val.bifptr.set_idx, val->val.bifptr.func_idx);
                
                /* fail if there's no descriptor */
                if (desc == 0)
                    return FALSE;
                
                /* point to the synthetic header */
                set((const uchar *)desc->synth_hdr);
            }
            return TRUE;

        default:
            /* other types are invalid */
            set((uchar *)0);
            return FALSE;
        }
    }
}